

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

void Seg_ManCreateCnf(Seg_Man_t *p,int fTwo,int fVerbose)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Gia_Obj_t *pGVar9;
  int *piVar10;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar11;
  abctime aVar12;
  bool bVar13;
  int Var3;
  int Var2;
  int Var1;
  int v3;
  int v2;
  int v1;
  int iObjId;
  Gia_Obj_t *pIn;
  int AddOn;
  int iDriverId;
  Gia_Obj_t *pOut;
  int iIn0;
  int nIns;
  int iCiId;
  int iBox;
  int nVarsLut;
  int iFirstLut;
  int nConstr;
  abctime clk;
  int value;
  int Edge;
  int nVars;
  int k;
  int i;
  int Count;
  int pLits [3];
  int iFirst;
  int iFanin;
  int iLut;
  Vec_Int_t *vLevel;
  Vec_Wec_t *vObjEdges;
  Gia_Obj_t *pObj;
  Tim_Man_t *pTim;
  int fVerbose_local;
  int fTwo_local;
  Seg_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pGia->pManTime;
  k = 0;
  aVar8 = Abc_Clock();
  iVar1 = sat_solver_nclauses(p->pSat);
  iFirst = 0;
  do {
    bVar13 = false;
    if (iFirst < p->pGia->nObjs) {
      vObjEdges = (Vec_Wec_t *)Gia_ManObj(p->pGia,iFirst);
      bVar13 = vObjEdges != (Vec_Wec_t *)0x0;
    }
    if (!bVar13) {
      if (k != p->nVars) {
        __assert_fail("Count == p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                      ,0x158,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
      }
      if (fVerbose != 0) {
        iVar4 = sat_solver_nclauses(p->pSat);
        printf("Delay constraints = %d. ",(ulong)(uint)(iVar4 - iVar1));
      }
      iVar1 = sat_solver_nclauses(p->pSat);
      pVVar11 = p->vEdges;
      iVar4 = Gia_ManObjNum(p->pGia);
      p_01 = Seg_ManCollectObjEdges(pVVar11,iVar4);
      for (nVars = 0; iVar4 = Vec_WecSize(p_01), nVars < iVar4; nVars = nVars + 1) {
        pVVar11 = Vec_WecEntry(p_01,nVars);
        if (((fTwo == 0) && (iVar4 = Vec_IntSize(pVVar11), 1 < iVar4)) ||
           ((fTwo != 0 && (iVar4 = Vec_IntSize(pVVar11), 10 < iVar4)))) {
          for (v3 = 0; iVar4 = Vec_IntSize(pVVar11), v3 < iVar4; v3 = v3 + 1) {
            iVar4 = Vec_IntEntry(pVVar11,v3);
            Var1 = v3;
            while( true ) {
              Var1 = Var1 + 1;
              iVar5 = Vec_IntSize(pVVar11);
              if (iVar5 <= Var1) break;
              iVar5 = Vec_IntEntry(pVVar11,Var1);
              i = Abc_Var2Lit(iVar4,1);
              Count = Abc_Var2Lit(iVar5,1);
              iVar5 = sat_solver_addclause(p->pSat,&i,pLits);
              if (iVar5 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x178,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
            }
          }
        }
        else if ((fTwo != 0) && (iVar4 = Vec_IntSize(pVVar11), 2 < iVar4)) {
          for (v3 = 0; iVar4 = Vec_IntSize(pVVar11), v3 < iVar4; v3 = v3 + 1) {
            iVar5 = Vec_IntEntry(pVVar11,v3);
            iVar4 = v3;
            while( true ) {
              Var1 = iVar4 + 1;
              iVar6 = Vec_IntSize(pVVar11);
              if (iVar6 <= Var1) break;
              iVar6 = Vec_IntEntry(pVVar11,Var1);
              for (Var2 = iVar4 + 2; iVar7 = Vec_IntSize(pVVar11), iVar4 = Var1, Var2 < iVar7;
                  Var2 = Var2 + 1) {
                iVar4 = Vec_IntEntry(pVVar11,Var2);
                i = Abc_Var2Lit(iVar5,1);
                Count = Abc_Var2Lit(iVar6,1);
                pLits[0] = Abc_Var2Lit(iVar4,1);
                iVar4 = sat_solver_addclause(p->pSat,&i,pLits + 1);
                if (iVar4 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x185,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
            }
          }
        }
      }
      Vec_WecFree(p_01);
      nVars = 0;
      while( true ) {
        iVar4 = Vec_IntSize(p->vToSkip);
        if (iVar4 <= nVars) {
          if (fVerbose != 0) {
            iVar4 = sat_solver_nclauses(p->pSat);
            printf("Edge constraints = %d. ",(ulong)(uint)(iVar4 - iVar1));
            aVar12 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar12 - aVar8);
          }
          return;
        }
        iVar4 = Vec_IntEntry(p->vToSkip,nVars);
        i = Abc_Var2Lit(iVar4,1);
        iVar4 = sat_solver_addclause(p->pSat,&i,&Count);
        if (iVar4 == 0) break;
        nVars = nVars + 1;
      }
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                    ,399,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
    }
    iVar4 = Vec_IntEntry(p->vFirsts,iFirst);
    iVar5 = Vec_IntEntry(p->vNvars,iFirst);
    if ((p_00 == (Tim_Man_t *)0x0) || (iVar6 = Gia_ObjIsCi((Gia_Obj_t *)vObjEdges), iVar6 == 0)) {
      iVar6 = Gia_ObjIsLut(p->pGia,iFirst);
      if (iVar6 != 0) {
        for (nVars = 0; iVar6 = Gia_ObjLutSize(p->pGia,iFirst), nVars < iVar6; nVars = nVars + 1) {
          piVar10 = Gia_ObjLutFanins(p->pGia,iFirst);
          pLits[2] = piVar10[nVars];
          if (p_00 == (Tim_Man_t *)0x0) {
LAB_009ed037:
            pGVar9 = Gia_ManObj(p->pGia,pLits[2]);
            iVar6 = Gia_ObjIsAnd(pGVar9);
            if (iVar6 != 0) {
              pLits[1] = Vec_IntEntry(p->vFirsts,pLits[2]);
              iVar6 = Vec_IntEntry(p->vNvars,pLits[2]);
              if ((iVar6 == 1) || (iVar5 <= iVar6)) {
                __assert_fail("nVars != 1 && nVars < nVarsLut",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x138,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
              if (iVar6 == 0) {
                i = Abc_Var2Lit(k,1);
                Count = Abc_Var2Lit(iVar4,0);
                iVar7 = sat_solver_addclause(p->pSat,&i,pLits);
                if (iVar7 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x13f,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                i = Abc_Var2Lit(k,0);
                Count = Abc_Var2Lit(iVar4 + 1,0);
                iVar7 = sat_solver_addclause(p->pSat,&i,pLits);
                if (iVar7 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x144,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
              for (Edge = 0; Edge < iVar6; Edge = Edge + 1) {
                i = Abc_Var2Lit(pLits[1] + Edge,1);
                Count = Abc_Var2Lit(k,1);
                pLits[0] = Abc_Var2Lit(iVar4 + Edge,0);
                iVar7 = sat_solver_addclause(p->pSat,&i,pLits + 1);
                if (iVar7 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x14d,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                i = Abc_Var2Lit(pLits[1] + Edge,1);
                Count = Abc_Var2Lit(k,0);
                pLits[0] = Abc_Var2Lit(iVar4 + Edge + 1,0);
                iVar7 = sat_solver_addclause(p->pSat,&i,pLits + 1);
                if (iVar7 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x153,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
              k = k + 1;
            }
          }
          else {
            pGVar9 = Gia_ManObj(p->pGia,pLits[2]);
            iVar6 = Gia_ObjIsCi(pGVar9);
            if (iVar6 == 0) goto LAB_009ed037;
            pLits[1] = Vec_IntEntry(p->vFirsts,pLits[2]);
            iVar6 = Vec_IntEntry(p->vNvars,pLits[2]);
            if (iVar5 < iVar6) {
              __assert_fail("nVars <= nVarsLut",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                            ,0x128,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
            }
            if (0 < iVar6) {
              for (Edge = 0; Edge < iVar6; Edge = Edge + 1) {
                i = Abc_Var2Lit(pLits[1] + Edge,1);
                Count = Abc_Var2Lit(iVar4 + Edge,0);
                iVar7 = sat_solver_addclause(p->pSat,&i,pLits);
                if (iVar7 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x130,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar6 = Gia_ObjCioId((Gia_Obj_t *)vObjEdges);
      iVar6 = Tim_ManBoxForCi(p_00,iVar6);
      if ((0 < iVar5) && (-1 < iVar6)) {
        iVar7 = Tim_ManBoxOutputFirst(p_00,iVar6);
        iVar2 = Gia_ObjCioId((Gia_Obj_t *)vObjEdges);
        if (iVar7 == iVar2) {
          iVar7 = Tim_ManBoxInputNum(p_00,iVar6);
          iVar6 = Tim_ManBoxInputFirst(p_00,iVar6);
          for (nVars = 0; nVars < iVar7 + -1; nVars = nVars + 1) {
            pGVar9 = Gia_ManCo(p->pGia,iVar6 + nVars);
            iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar9);
            pLits[1] = Vec_IntEntry(p->vFirsts,iVar2);
            iVar2 = Vec_IntEntry(p->vNvars,iVar2);
            if (iVar5 <= iVar2) {
              __assert_fail("nVars < nVarsLut",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                            ,0x101,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
            }
            for (Edge = 0; Edge < iVar2; Edge = Edge + 1) {
              i = Abc_Var2Lit(pLits[1] + Edge,1);
              Count = Abc_Var2Lit(iVar4 + Edge + (uint)(iVar2 < iVar5),0);
              iVar3 = sat_solver_addclause(p->pSat,&i,pLits);
              if (iVar3 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x108,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
            }
          }
        }
        else {
          pGVar9 = Gia_ManCi(p->pGia,iVar7);
          iVar5 = Gia_ObjId(p->pGia,pGVar9);
          pLits[1] = Vec_IntEntry(p->vFirsts,iVar5);
          iVar5 = Vec_IntEntry(p->vNvars,iVar5);
          if (0 < iVar5) {
            for (Edge = 0; Edge < iVar5; Edge = Edge + 1) {
              i = Abc_Var2Lit(pLits[1] + Edge,1);
              Count = Abc_Var2Lit(iVar4 + Edge,0);
              iVar6 = sat_solver_addclause(p->pSat,&i,pLits);
              if (iVar6 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x11a,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
            }
          }
        }
      }
    }
    iFirst = iFirst + 1;
  } while( true );
}

Assistant:

void Seg_ManCreateCnf( Seg_Man_t * p, int fTwo, int fVerbose )
{
    Tim_Man_t * pTim = (Tim_Man_t *)p->pGia->pManTime;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vObjEdges;
    Vec_Int_t * vLevel;
    int iLut, iFanin, iFirst;
    int pLits[3], Count = 0;
    int i, k, nVars, Edge, value;
    abctime clk = Abc_Clock();
    // edge delay constraints
    int nConstr = sat_solver_nclauses(p->pSat);
    Gia_ManForEachObj( p->pGia, pObj, iLut )
    {
        int iFirstLut = Vec_IntEntry( p->vFirsts, iLut );
        int nVarsLut  = Vec_IntEntry( p->vNvars, iLut );
        if ( pTim && Gia_ObjIsCi(pObj) )
        {
            int iBox = Tim_ManBoxForCi( pTim, Gia_ObjCioId(pObj) );
            if ( nVarsLut > 0 && iBox >= 0 )
            {
                int iCiId = Tim_ManBoxOutputFirst( pTim, iBox );
                if ( iCiId == Gia_ObjCioId(pObj) ) // first input
                {
                    int nIns = Tim_ManBoxInputNum( pTim, iBox );
                    int iIn0 = Tim_ManBoxInputFirst( pTim, iBox );
                    for ( i = 0; i < nIns-1; i++ ) // skip carry-in pin
                    {
                        Gia_Obj_t * pOut = Gia_ManCo( p->pGia, iIn0+i );
                        int iDriverId = Gia_ObjFaninId0p( p->pGia, pOut );
                        int AddOn;

                        iFirst = Vec_IntEntry( p->vFirsts, iDriverId );
                        nVars  = Vec_IntEntry( p->vNvars, iDriverId );
                        assert( nVars < nVarsLut );
                        AddOn = (int)(nVars < nVarsLut);
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k+AddOn, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
                else // intermediate input
                {
                    Gia_Obj_t * pIn = Gia_ManCi( p->pGia, iCiId );
                    int iObjId = Gia_ObjId( p->pGia, pIn );

                    iFirst = Vec_IntEntry( p->vFirsts, iObjId );
                    nVars  = Vec_IntEntry( p->vNvars, iObjId );
                    if ( nVars > 0 )
                    {
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
            }
            continue;
        }
        if ( !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        Gia_LutForEachFanin( p->pGia, iLut, iFanin, i )
            if ( pTim && Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars <= nVarsLut );
                if ( nVars > 0 )
                {
                    for ( k = 0; k < nVars; k++ )
                    {
                        pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                        pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                        value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                        assert( value );
                    }
                }
            }
            else if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars != 1 && nVars < nVarsLut );
                // add initial
                if ( nVars == 0 )
                {
                    pLits[0] = Abc_Var2Lit( Count, 1 );
                    pLits[1] = Abc_Var2Lit( iFirstLut, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( Count, 0 );
                    pLits[1] = Abc_Var2Lit( iFirstLut+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );
                }
                // add others
                for ( k = 0; k < nVars; k++ )
                {
                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 1 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 0 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );
                }
                Count++;
            }
    }
    assert( Count == p->nVars );
    if ( fVerbose )
    printf( "Delay constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    nConstr = sat_solver_nclauses(p->pSat);
/*
    // delay relationship constraints
    Vec_IntForEachEntryTwo( p->vFirsts, p->vNvars, iFirst, nVars, iLut )
    {
        if ( nVars < 2 )
            continue;
        for ( i = 1; i < nVars; i++ )
        {
            pLits[0] = Abc_Var2Lit( iFirst + i - 1, 1 );
            pLits[1] = Abc_Var2Lit( iFirst + i,     0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
            assert( value );
        }
    }
*/
    // edge compatibility constraint
    vObjEdges = Seg_ManCollectObjEdges( p->vEdges, Gia_ManObjNum(p->pGia) );
    Vec_WecForEachLevel( vObjEdges, vLevel, i )
    {
        int v1, v2, v3, Var1, Var2, Var3;
        if ( (!fTwo && Vec_IntSize(vLevel) >= 2) || (fTwo && Vec_IntSize(vLevel) > 10) )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                assert( value );
            }
        }
        else if ( fTwo && Vec_IntSize(vLevel) >= 3 )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            Vec_IntForEachEntryStart( vLevel, Var3, v3, v2 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                pLits[2] = Abc_Var2Lit( Var3, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                assert( value );
            }
        }
    }
    Vec_WecFree( vObjEdges );
    // block forbidden edges
    Vec_IntForEachEntry( p->vToSkip, Edge, i )
    {
        pLits[0] = Abc_Var2Lit( Edge, 1 );
        value = sat_solver_addclause( p->pSat, pLits, pLits+1 );
        assert( value );
    }
    if ( fVerbose )
    printf( "Edge constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}